

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_gen_blind_reset(void)

{
  int iVar1;
  secp256k1_ge p2;
  secp256k1_ge p1;
  secp256k1_scalar b;
  secp256k1_scalar *in_stack_ffffffffffffff28;
  secp256k1_scalar *in_stack_ffffffffffffff30;
  secp256k1_ge *in_stack_ffffffffffffff50;
  secp256k1_ge *in_stack_ffffffffffffff58;
  undefined1 local_78 [88];
  uint64_t local_20;
  uint64_t local_18;
  uint64_t local_10;
  uint64_t local_8;
  
  secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)b.d[1],(uchar *)b.d[0]);
  local_20 = (CTX->ecmult_gen_ctx).scalar_offset.d[0];
  local_18 = (CTX->ecmult_gen_ctx).scalar_offset.d[1];
  local_10 = (CTX->ecmult_gen_ctx).scalar_offset.d[2];
  local_8 = (CTX->ecmult_gen_ctx).scalar_offset.d[3];
  memcpy(local_78,&(CTX->ecmult_gen_ctx).ge_offset,0x58);
  secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)b.d[1],(uchar *)b.d[0]);
  iVar1 = secp256k1_scalar_eq(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x15b2,
            "test condition failed: secp256k1_scalar_eq(&b, &CTX->ecmult_gen_ctx.scalar_offset)");
    abort();
  }
  memcpy(&stack0xffffffffffffff30,&(CTX->ecmult_gen_ctx).ge_offset,0x58);
  iVar1 = secp256k1_ge_eq_var(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x15b4,"test condition failed: secp256k1_ge_eq_var(&p1, &p2)");
    abort();
  }
  return;
}

Assistant:

static void test_ecmult_gen_blind_reset(void) {
    /* Test ecmult_gen() blinding reset and confirm that the blinding is consistent. */
    secp256k1_scalar b;
    secp256k1_ge p1, p2;
    secp256k1_ecmult_gen_blind(&CTX->ecmult_gen_ctx, 0);
    b = CTX->ecmult_gen_ctx.scalar_offset;
    p1 = CTX->ecmult_gen_ctx.ge_offset;
    secp256k1_ecmult_gen_blind(&CTX->ecmult_gen_ctx, 0);
    CHECK(secp256k1_scalar_eq(&b, &CTX->ecmult_gen_ctx.scalar_offset));
    p2 = CTX->ecmult_gen_ctx.ge_offset;
    CHECK(secp256k1_ge_eq_var(&p1, &p2));
}